

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QObject*,QPointer<QHttp2Stream>>::emplaceValue<QPointer<QHttp2Stream>>
          (Node<QObject*,QPointer<QHttp2Stream>> *this,QPointer<QHttp2Stream> *args)

{
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (args->wp).d;
  local_28.value = (args->wp).value;
  (args->wp).d = (Data *)0x0;
  (args->wp).value = (QObject *)0x0;
  QWeakPointer<QObject>::operator=((QWeakPointer<QObject> *)(this + 8),&local_28);
  QWeakPointer<QObject>::~QWeakPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }